

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O2

int AF_A_SoAExplode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  DObject *this;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  AActor *this_00;
  PClassActor *type;
  AActor *ent;
  long lVar8;
  char *__assertion;
  FSoundID local_50;
  FName local_4c;
  DVector3 local_48;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053e910;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0053e6b0:
        ent = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053e910;
        }
      }
      if (numparam == 1) goto LAB_0053e730;
      VVar2 = param[1].field_0.field_3.Type;
      if (VVar2 != 0xff) {
        if (VVar2 != '\x03') goto LAB_0053e900;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053e910;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053e900;
      }
      if ((((uint)numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
         ((VVar2 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053e730:
        for (lVar8 = 0; lVar8 != 400; lVar8 = lVar8 + 0x28) {
          iVar4 = FRandom::operator()(&pr_soaexplode);
          iVar5 = FRandom::operator()(&pr_soaexplode);
          iVar6 = FRandom::operator()(&pr_soaexplode);
          dVar1 = ent->Height;
          FName::FName(&local_4c,"ZArmorChunk");
          AActor::Vec3Offset(&local_48,ent,(double)(iVar4 + -0x80) * 0.0625,
                             (double)(iVar5 + -0x80) * 0.0625,(double)iVar6 * dVar1 * 0.00390625,
                             false);
          this_00 = Spawn(&local_4c,&local_48,ALLOW_REPLACE);
          if (this_00 != (AActor *)0x0) {
            AActor::SetState(this_00,(FState *)((long)&this_00->SpawnState->NextState + lVar8),false
                            );
            iVar4 = FRandom::Random2(&pr_soaexplode);
            (this_00->Vel).X = (double)iVar4 * 0.015625;
            iVar4 = FRandom::Random2(&pr_soaexplode);
            (this_00->Vel).Y = (double)iVar4 * 0.015625;
            uVar7 = FRandom::operator()(&pr_soaexplode);
            (this_00->Vel).Z = (double)((uVar7 & 7) + 5);
          }
        }
        type = P_GetSpawnableType(ent->args[0]);
        if ((type != (PClassActor *)0x0) &&
           ((((level.flags2._1_1_ & 0x80) == 0 && ((dmflags.Value._1_1_ & 0x10) == 0)) ||
            (((type->super_PClass).Defaults[0x195] & 0x20) == 0)))) {
          local_48.X = (ent->__Pos).X;
          local_48.Y = (ent->__Pos).Y;
          local_48.Z = (ent->__Pos).Z;
          Spawn(type,&local_48,ALLOW_REPLACE);
        }
        local_50.ID = (ent->DeathSound).super_FSoundID.ID;
        S_Sound(ent,4,&local_50,1.0,1.0);
        (*(ent->super_DThinker).super_DObject._vptr_DObject[4])(ent);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053e910;
    }
    if (ent == (AActor *)0x0) goto LAB_0053e6b0;
  }
LAB_0053e900:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053e910:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SoAExplode)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = 0; i < 10; i++)
	{
		double xo = (pr_soaexplode() - 128) / 16.;
		double yo = (pr_soaexplode() - 128) / 16.;
		double zo = pr_soaexplode()*self->Height / 256.;
		mo = Spawn ("ZArmorChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + i);
			mo->Vel.X = pr_soaexplode.Random2() / 64.;
			mo->Vel.Y = pr_soaexplode.Random2() / 64.;
			mo->Vel.Z = (pr_soaexplode() & 7) + 5;
		}
	}
	// Spawn an item?
	PClassActor *type = P_GetSpawnableType(self->args[0]);
	if (type != NULL)
	{
		if (!((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS))
		|| !(GetDefaultByType (type)->flags3 & MF3_ISMONSTER))
		{ // Only spawn monsters if not -nomonsters
			Spawn (type, self->Pos(), ALLOW_REPLACE);
		}
	}
	S_Sound (self, CHAN_BODY, self->DeathSound, 1, ATTN_NORM);
	self->Destroy ();
	return 0;
}